

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImDrawListSplitter::Merge(ImDrawListSplitter *this,ImDrawList *draw_list)

{
  ImDrawCmdHeader *pIVar1;
  ImDrawChannel *pIVar2;
  unsigned_short *__src;
  ImDrawChannel *pIVar3;
  undefined8 uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  ImDrawCmd *pIVar13;
  long lVar14;
  ImDrawCmd *pIVar15;
  uint *puVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  long lVar22;
  uint uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  unsigned_short *local_40;
  
  if (this->_Count < 2) {
    return;
  }
  uVar10 = 0;
  SetCurrentChannel(this,draw_list,0);
  uVar23 = (draw_list->CmdBuffer).Size;
  lVar11 = (long)(int)uVar23;
  if (lVar11 == 0) {
    uVar9 = this->_Count;
    if (0 < (int)uVar9) goto LAB_0012c7f6;
LAB_0012c913:
    iVar18 = 0;
    iVar17 = 0;
  }
  else {
    pIVar15 = (draw_list->CmdBuffer).Data;
    if ((pIVar15[lVar11 + -1].ElemCount == 0) &&
       (pIVar15[lVar11 + -1].UserCallback == (ImDrawCallback)0x0)) {
      uVar23 = uVar23 - 1;
      (draw_list->CmdBuffer).Size = uVar23;
    }
    uVar9 = this->_Count;
    uVar10 = uVar23;
    if ((int)uVar9 < 1) goto LAB_0012c913;
    if ((int)uVar23 < 1) {
LAB_0012c7f6:
      pIVar13 = (ImDrawCmd *)0x0;
      uVar23 = 0;
    }
    else {
      pIVar15 = (draw_list->CmdBuffer).Data;
      pIVar13 = pIVar15 + ((ulong)uVar23 - 1);
      if (pIVar13 == (ImDrawCmd *)0x0) goto LAB_0012c7f6;
      uVar23 = pIVar15[(ulong)uVar23 - 1].ElemCount + pIVar15[(ulong)uVar23 - 1].IdxOffset;
    }
    if (uVar9 < 2) {
      iVar18 = 0;
      iVar17 = 0;
    }
    else {
      iVar17 = 0;
      lVar11 = 1;
      iVar18 = 0;
      do {
        pIVar2 = (this->_Channels).Data;
        pIVar3 = pIVar2 + lVar11;
        iVar19 = pIVar2[lVar11]._CmdBuffer.Size;
        uVar12 = (ulong)iVar19;
        if ((long)uVar12 < 1) {
LAB_0012c8f0:
          iVar21 = (pIVar3->_IdxBuffer).Size;
        }
        else {
          pIVar15 = (pIVar3->_CmdBuffer).Data;
          if ((pIVar15[uVar12 - 1].ElemCount == 0) &&
             (pIVar15[uVar12 - 1].UserCallback == (ImDrawCallback)0x0)) {
            uVar12 = (ulong)(iVar19 - 1U);
            (pIVar3->_CmdBuffer).Size = iVar19 - 1U;
          }
          if (((int)uVar12 == 0) || (pIVar13 == (ImDrawCmd *)0x0)) {
LAB_0012c8c0:
            iVar19 = (int)uVar12;
            if (iVar19 < 1) goto LAB_0012c8f0;
          }
          else {
            pIVar15 = (pIVar3->_CmdBuffer).Data;
            auVar26[0] = -(*(char *)&(pIVar15->ClipRect).x == *(char *)&(pIVar13->ClipRect).x);
            auVar26[1] = -(*(char *)((long)&(pIVar15->ClipRect).x + 1) ==
                          *(char *)((long)&(pIVar13->ClipRect).x + 1));
            auVar26[2] = -(*(char *)((long)&(pIVar15->ClipRect).x + 2) ==
                          *(char *)((long)&(pIVar13->ClipRect).x + 2));
            auVar26[3] = -(*(char *)((long)&(pIVar15->ClipRect).x + 3) ==
                          *(char *)((long)&(pIVar13->ClipRect).x + 3));
            auVar26[4] = -(*(char *)&(pIVar15->ClipRect).y == *(char *)&(pIVar13->ClipRect).y);
            auVar26[5] = -(*(char *)((long)&(pIVar15->ClipRect).y + 1) ==
                          *(char *)((long)&(pIVar13->ClipRect).y + 1));
            auVar26[6] = -(*(char *)((long)&(pIVar15->ClipRect).y + 2) ==
                          *(char *)((long)&(pIVar13->ClipRect).y + 2));
            auVar26[7] = -(*(char *)((long)&(pIVar15->ClipRect).y + 3) ==
                          *(char *)((long)&(pIVar13->ClipRect).y + 3));
            auVar26[8] = -(*(char *)&(pIVar15->ClipRect).z == *(char *)&(pIVar13->ClipRect).z);
            auVar26[9] = -(*(char *)((long)&(pIVar15->ClipRect).z + 1) ==
                          *(char *)((long)&(pIVar13->ClipRect).z + 1));
            auVar26[10] = -(*(char *)((long)&(pIVar15->ClipRect).z + 2) ==
                           *(char *)((long)&(pIVar13->ClipRect).z + 2));
            auVar26[0xb] = -(*(char *)((long)&(pIVar15->ClipRect).z + 3) ==
                            *(char *)((long)&(pIVar13->ClipRect).z + 3));
            auVar26[0xc] = -(*(char *)&(pIVar15->ClipRect).w == *(char *)&(pIVar13->ClipRect).w);
            auVar26[0xd] = -(*(char *)((long)&(pIVar15->ClipRect).w + 1) ==
                            *(char *)((long)&(pIVar13->ClipRect).w + 1));
            auVar26[0xe] = -(*(char *)((long)&(pIVar15->ClipRect).w + 2) ==
                            *(char *)((long)&(pIVar13->ClipRect).w + 2));
            auVar26[0xf] = -(*(char *)((long)&(pIVar15->ClipRect).w + 3) ==
                            *(char *)((long)&(pIVar13->ClipRect).w + 3));
            auVar24[0] = -(*(char *)&(pIVar15->ClipRect).w == *(char *)&(pIVar13->ClipRect).w);
            auVar24[1] = -(*(char *)((long)&(pIVar15->ClipRect).w + 1) ==
                          *(char *)((long)&(pIVar13->ClipRect).w + 1));
            auVar24[2] = -(*(char *)((long)&(pIVar15->ClipRect).w + 2) ==
                          *(char *)((long)&(pIVar13->ClipRect).w + 2));
            auVar24[3] = -(*(char *)((long)&(pIVar15->ClipRect).w + 3) ==
                          *(char *)((long)&(pIVar13->ClipRect).w + 3));
            auVar24[4] = -(*(char *)&pIVar15->TextureId == *(char *)&pIVar13->TextureId);
            auVar24[5] = -(*(char *)((long)&pIVar15->TextureId + 1) ==
                          *(char *)((long)&pIVar13->TextureId + 1));
            auVar24[6] = -(*(char *)((long)&pIVar15->TextureId + 2) ==
                          *(char *)((long)&pIVar13->TextureId + 2));
            auVar24[7] = -(*(char *)((long)&pIVar15->TextureId + 3) ==
                          *(char *)((long)&pIVar13->TextureId + 3));
            auVar24[8] = -(*(char *)((long)&pIVar15->TextureId + 4) ==
                          *(char *)((long)&pIVar13->TextureId + 4));
            auVar24[9] = -(*(char *)((long)&pIVar15->TextureId + 5) ==
                          *(char *)((long)&pIVar13->TextureId + 5));
            auVar24[10] = -(*(char *)((long)&pIVar15->TextureId + 6) ==
                           *(char *)((long)&pIVar13->TextureId + 6));
            auVar24[0xb] = -(*(char *)((long)&pIVar15->TextureId + 7) ==
                            *(char *)((long)&pIVar13->TextureId + 7));
            auVar24[0xc] = -((char)pIVar15->VtxOffset == (char)pIVar13->VtxOffset);
            auVar24[0xd] = -(*(char *)((long)&pIVar15->VtxOffset + 1) ==
                            *(char *)((long)&pIVar13->VtxOffset + 1));
            auVar24[0xe] = -(*(char *)((long)&pIVar15->VtxOffset + 2) ==
                            *(char *)((long)&pIVar13->VtxOffset + 2));
            auVar24[0xf] = -(*(char *)((long)&pIVar15->VtxOffset + 3) ==
                            *(char *)((long)&pIVar13->VtxOffset + 3));
            auVar24 = auVar24 & auVar26;
            if (((ushort)((ushort)(SUB161(auVar24 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar24 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar24 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar24 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar24 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar24 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar24 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar24 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar24 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar24 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar24 >> 0x77,0) & 1) << 0xe |
                         (ushort)(byte)(auVar24[0xf] >> 7) << 0xf) == 0xffff) &&
               (pIVar15->UserCallback == (ImDrawCallback)0x0 &&
                pIVar13->UserCallback == (ImDrawCallback)0x0)) {
              pIVar13->ElemCount = pIVar13->ElemCount + pIVar15->ElemCount;
              uVar23 = uVar23 + pIVar15->ElemCount;
              memmove(pIVar15,pIVar15 + 1,(uVar12 & 0xffffffff) * 0x38 - 0x38);
              uVar10 = (pIVar3->_CmdBuffer).Size - 1;
              uVar12 = (ulong)uVar10;
              (pIVar3->_CmdBuffer).Size = uVar10;
              goto LAB_0012c8c0;
            }
          }
          pIVar15 = (pIVar3->_CmdBuffer).Data;
          iVar19 = (int)uVar12;
          uVar12 = uVar12 & 0xffffffff;
          pIVar13 = pIVar15 + (uVar12 - 1);
          iVar21 = (pIVar3->_IdxBuffer).Size;
          puVar16 = &pIVar15->ElemCount;
          do {
            puVar16[-1] = uVar23;
            uVar23 = uVar23 + *puVar16;
            puVar16 = puVar16 + 0xe;
            uVar12 = uVar12 - 1;
          } while (uVar12 != 0);
        }
        iVar18 = iVar18 + iVar21;
        iVar17 = iVar17 + iVar19;
        lVar11 = lVar11 + 1;
      } while (lVar11 < this->_Count);
      uVar10 = (draw_list->CmdBuffer).Size;
    }
  }
  iVar21 = uVar10 + iVar17;
  iVar19 = (draw_list->CmdBuffer).Capacity;
  if (iVar19 < iVar21) {
    if (iVar19 == 0) {
      iVar19 = 8;
    }
    else {
      iVar19 = iVar19 / 2 + iVar19;
    }
    if (iVar19 <= iVar21) {
      iVar19 = iVar21;
    }
    pIVar13 = (ImDrawCmd *)ImGui::MemAlloc((long)iVar19 * 0x38);
    pIVar15 = (draw_list->CmdBuffer).Data;
    if (pIVar15 != (ImDrawCmd *)0x0) {
      memcpy(pIVar13,pIVar15,(long)(draw_list->CmdBuffer).Size * 0x38);
      ImGui::MemFree((draw_list->CmdBuffer).Data);
    }
    (draw_list->CmdBuffer).Data = pIVar13;
    (draw_list->CmdBuffer).Capacity = iVar19;
  }
  (draw_list->CmdBuffer).Size = iVar21;
  lVar11 = (long)(draw_list->IdxBuffer).Size + (long)iVar18;
  iVar19 = (draw_list->IdxBuffer).Capacity;
  iVar20 = (int)lVar11;
  if (iVar19 < iVar20) {
    if (iVar19 == 0) {
      iVar19 = 8;
    }
    else {
      iVar19 = iVar19 / 2 + iVar19;
    }
    if (iVar19 <= iVar20) {
      iVar19 = iVar20;
    }
    local_40 = (unsigned_short *)ImGui::MemAlloc((long)iVar19 * 2);
    __src = (draw_list->IdxBuffer).Data;
    if (__src != (unsigned_short *)0x0) {
      memcpy(local_40,__src,(long)(draw_list->IdxBuffer).Size * 2);
      ImGui::MemFree((draw_list->IdxBuffer).Data);
    }
    (draw_list->IdxBuffer).Data = local_40;
    (draw_list->IdxBuffer).Capacity = iVar19;
    iVar21 = (draw_list->CmdBuffer).Size;
  }
  else {
    local_40 = (draw_list->IdxBuffer).Data;
  }
  (draw_list->IdxBuffer).Size = iVar20;
  local_40 = local_40 + (lVar11 - iVar18);
  if (1 < this->_Count) {
    pIVar15 = (draw_list->CmdBuffer).Data + ((long)iVar21 - (long)iVar17);
    lVar22 = 1;
    lVar11 = 0x38;
    do {
      pIVar3 = (this->_Channels).Data;
      lVar14 = (long)*(int *)((long)pIVar3 + lVar11 + -0x18);
      if (lVar14 != 0) {
        memcpy(pIVar15,*(void **)((long)pIVar3 + lVar11 + -0x10),lVar14 * 0x38);
        pIVar15 = pIVar15 + lVar14;
      }
      lVar14 = (long)*(int *)((long)pIVar3 + lVar11 + -8);
      if (lVar14 != 0) {
        memcpy(local_40,*(void **)((long)&(pIVar3->_CmdBuffer).Size + lVar11),lVar14 * 2);
        local_40 = local_40 + lVar14;
      }
      lVar22 = lVar22 + 1;
      lVar11 = lVar11 + 0x20;
    } while (lVar22 < this->_Count);
    iVar21 = (draw_list->CmdBuffer).Size;
  }
  draw_list->_IdxWritePtr = local_40;
  if (iVar21 != 0) {
    pIVar15 = (draw_list->CmdBuffer).Data;
    lVar11 = (long)iVar21;
    if (pIVar15[lVar11 + -1].UserCallback == (ImDrawCallback)0x0) goto LAB_0012cafd;
  }
  ImDrawList::AddDrawCmd(draw_list);
  pIVar15 = (draw_list->CmdBuffer).Data;
  lVar11 = (long)(draw_list->CmdBuffer).Size;
LAB_0012cafd:
  pIVar13 = pIVar15 + lVar11 + -1;
  pIVar1 = &draw_list->_CmdHeader;
  if (pIVar15[lVar11 + -1].ElemCount == 0) {
    fVar5 = (pIVar1->ClipRect).x;
    fVar6 = (pIVar1->ClipRect).y;
    fVar7 = (draw_list->_CmdHeader).ClipRect.z;
    fVar8 = (draw_list->_CmdHeader).ClipRect.w;
    uVar4 = *(undefined8 *)((long)&(draw_list->_CmdHeader).TextureId + 4);
    *(undefined8 *)&pIVar15[lVar11 + -1].ClipRect.w =
         *(undefined8 *)&(draw_list->_CmdHeader).ClipRect.w;
    *(undefined8 *)((long)&pIVar15[lVar11 + -1].TextureId + 4) = uVar4;
    (pIVar13->ClipRect).x = fVar5;
    (pIVar13->ClipRect).y = fVar6;
    pIVar15[lVar11 + -1].ClipRect.z = fVar7;
    pIVar15[lVar11 + -1].ClipRect.w = fVar8;
  }
  else {
    auVar27[0] = -(*(char *)&(pIVar1->ClipRect).x == *(char *)&(pIVar13->ClipRect).x);
    auVar27[1] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.x + 1) ==
                  *(char *)((long)&pIVar15[lVar11 + -1].ClipRect.x + 1));
    auVar27[2] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.x + 2) ==
                  *(char *)((long)&pIVar15[lVar11 + -1].ClipRect.x + 2));
    auVar27[3] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.x + 3) ==
                  *(char *)((long)&pIVar15[lVar11 + -1].ClipRect.x + 3));
    auVar27[4] = -(*(char *)&(draw_list->_CmdHeader).ClipRect.y ==
                  *(char *)&pIVar15[lVar11 + -1].ClipRect.y);
    auVar27[5] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.y + 1) ==
                  *(char *)((long)&pIVar15[lVar11 + -1].ClipRect.y + 1));
    auVar27[6] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.y + 2) ==
                  *(char *)((long)&pIVar15[lVar11 + -1].ClipRect.y + 2));
    auVar27[7] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.y + 3) ==
                  *(char *)((long)&pIVar15[lVar11 + -1].ClipRect.y + 3));
    auVar27[8] = -(*(char *)&(draw_list->_CmdHeader).ClipRect.z ==
                  *(char *)&pIVar15[lVar11 + -1].ClipRect.z);
    auVar27[9] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.z + 1) ==
                  *(char *)((long)&pIVar15[lVar11 + -1].ClipRect.z + 1));
    auVar27[10] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.z + 2) ==
                   *(char *)((long)&pIVar15[lVar11 + -1].ClipRect.z + 2));
    auVar27[0xb] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.z + 3) ==
                    *(char *)((long)&pIVar15[lVar11 + -1].ClipRect.z + 3));
    auVar27[0xc] = -(*(char *)&(draw_list->_CmdHeader).ClipRect.w ==
                    *(char *)&pIVar15[lVar11 + -1].ClipRect.w);
    auVar27[0xd] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.w + 1) ==
                    *(char *)((long)&pIVar15[lVar11 + -1].ClipRect.w + 1));
    auVar27[0xe] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.w + 2) ==
                    *(char *)((long)&pIVar15[lVar11 + -1].ClipRect.w + 2));
    auVar27[0xf] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.w + 3) ==
                    *(char *)((long)&pIVar15[lVar11 + -1].ClipRect.w + 3));
    auVar25[0] = -(*(char *)&(draw_list->_CmdHeader).ClipRect.w ==
                  *(char *)&pIVar15[lVar11 + -1].ClipRect.w);
    auVar25[1] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.w + 1) ==
                  *(char *)((long)&pIVar15[lVar11 + -1].ClipRect.w + 1));
    auVar25[2] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.w + 2) ==
                  *(char *)((long)&pIVar15[lVar11 + -1].ClipRect.w + 2));
    auVar25[3] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.w + 3) ==
                  *(char *)((long)&pIVar15[lVar11 + -1].ClipRect.w + 3));
    auVar25[4] = -(*(char *)&(draw_list->_CmdHeader).TextureId ==
                  *(char *)&pIVar15[lVar11 + -1].TextureId);
    auVar25[5] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 1) ==
                  *(char *)((long)&pIVar15[lVar11 + -1].TextureId + 1));
    auVar25[6] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 2) ==
                  *(char *)((long)&pIVar15[lVar11 + -1].TextureId + 2));
    auVar25[7] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 3) ==
                  *(char *)((long)&pIVar15[lVar11 + -1].TextureId + 3));
    auVar25[8] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 4) ==
                  *(char *)((long)&pIVar15[lVar11 + -1].TextureId + 4));
    auVar25[9] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 5) ==
                  *(char *)((long)&pIVar15[lVar11 + -1].TextureId + 5));
    auVar25[10] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 6) ==
                   *(char *)((long)&pIVar15[lVar11 + -1].TextureId + 6));
    auVar25[0xb] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 7) ==
                    *(char *)((long)&pIVar15[lVar11 + -1].TextureId + 7));
    auVar25[0xc] = -((char)(draw_list->_CmdHeader).VtxOffset == (char)pIVar15[lVar11 + -1].VtxOffset
                    );
    auVar25[0xd] = -(*(char *)((long)&(draw_list->_CmdHeader).VtxOffset + 1) ==
                    *(char *)((long)&pIVar15[lVar11 + -1].VtxOffset + 1));
    auVar25[0xe] = -(*(char *)((long)&(draw_list->_CmdHeader).VtxOffset + 2) ==
                    *(char *)((long)&pIVar15[lVar11 + -1].VtxOffset + 2));
    auVar25[0xf] = -(*(char *)((long)&(draw_list->_CmdHeader).VtxOffset + 3) ==
                    *(char *)((long)&pIVar15[lVar11 + -1].VtxOffset + 3));
    auVar25 = auVar25 & auVar27;
    if ((ushort)((ushort)(SUB161(auVar25 >> 7,0) & 1) | (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar25[0xf] >> 7) << 0xf) != 0xffff) {
      ImDrawList::AddDrawCmd(draw_list);
    }
  }
  this->_Count = 1;
  return;
}

Assistant:

void ImDrawListSplitter::Merge(ImDrawList* draw_list)
{
    // Note that we never use or rely on _Channels.Size because it is merely a buffer that we never shrink back to 0 to keep all sub-buffers ready for use.
    if (_Count <= 1)
        return;

    SetCurrentChannel(draw_list, 0);
    draw_list->_PopUnusedDrawCmd();

    // Calculate our final buffer sizes. Also fix the incorrect IdxOffset values in each command.
    int new_cmd_buffer_count = 0;
    int new_idx_buffer_count = 0;
    ImDrawCmd* last_cmd = (_Count > 0 && draw_list->CmdBuffer.Size > 0) ? &draw_list->CmdBuffer.back() : NULL;
    int idx_offset = last_cmd ? last_cmd->IdxOffset + last_cmd->ElemCount : 0;
    for (int i = 1; i < _Count; i++)
    {
        ImDrawChannel& ch = _Channels[i];
        if (ch._CmdBuffer.Size > 0 && ch._CmdBuffer.back().ElemCount == 0 && ch._CmdBuffer.back().UserCallback == NULL) // Equivalent of PopUnusedDrawCmd()
            ch._CmdBuffer.pop_back();

        if (ch._CmdBuffer.Size > 0 && last_cmd != NULL)
        {
            // Do not include ImDrawCmd_AreSequentialIdxOffset() in the compare as we rebuild IdxOffset values ourselves.
            // Manipulating IdxOffset (e.g. by reordering draw commands like done by RenderDimmedBackgroundBehindWindow()) is not supported within a splitter.
            ImDrawCmd* next_cmd = &ch._CmdBuffer[0];
            if (ImDrawCmd_HeaderCompare(last_cmd, next_cmd) == 0 && last_cmd->UserCallback == NULL && next_cmd->UserCallback == NULL)
            {
                // Merge previous channel last draw command with current channel first draw command if matching.
                last_cmd->ElemCount += next_cmd->ElemCount;
                idx_offset += next_cmd->ElemCount;
                ch._CmdBuffer.erase(ch._CmdBuffer.Data); // FIXME-OPT: Improve for multiple merges.
            }
        }
        if (ch._CmdBuffer.Size > 0)
            last_cmd = &ch._CmdBuffer.back();
        new_cmd_buffer_count += ch._CmdBuffer.Size;
        new_idx_buffer_count += ch._IdxBuffer.Size;
        for (int cmd_n = 0; cmd_n < ch._CmdBuffer.Size; cmd_n++)
        {
            ch._CmdBuffer.Data[cmd_n].IdxOffset = idx_offset;
            idx_offset += ch._CmdBuffer.Data[cmd_n].ElemCount;
        }
    }
    draw_list->CmdBuffer.resize(draw_list->CmdBuffer.Size + new_cmd_buffer_count);
    draw_list->IdxBuffer.resize(draw_list->IdxBuffer.Size + new_idx_buffer_count);

    // Write commands and indices in order (they are fairly small structures, we don't copy vertices only indices)
    ImDrawCmd* cmd_write = draw_list->CmdBuffer.Data + draw_list->CmdBuffer.Size - new_cmd_buffer_count;
    ImDrawIdx* idx_write = draw_list->IdxBuffer.Data + draw_list->IdxBuffer.Size - new_idx_buffer_count;
    for (int i = 1; i < _Count; i++)
    {
        ImDrawChannel& ch = _Channels[i];
        if (int sz = ch._CmdBuffer.Size) { memcpy(cmd_write, ch._CmdBuffer.Data, sz * sizeof(ImDrawCmd)); cmd_write += sz; }
        if (int sz = ch._IdxBuffer.Size) { memcpy(idx_write, ch._IdxBuffer.Data, sz * sizeof(ImDrawIdx)); idx_write += sz; }
    }
    draw_list->_IdxWritePtr = idx_write;

    // Ensure there's always a non-callback draw command trailing the command-buffer
    if (draw_list->CmdBuffer.Size == 0 || draw_list->CmdBuffer.back().UserCallback != NULL)
        draw_list->AddDrawCmd();

    // If current command is used with different settings we need to add a new command
    ImDrawCmd* curr_cmd = &draw_list->CmdBuffer.Data[draw_list->CmdBuffer.Size - 1];
    if (curr_cmd->ElemCount == 0)
        ImDrawCmd_HeaderCopy(curr_cmd, &draw_list->_CmdHeader); // Copy ClipRect, TextureId, VtxOffset
    else if (ImDrawCmd_HeaderCompare(curr_cmd, &draw_list->_CmdHeader) != 0)
        draw_list->AddDrawCmd();

    _Count = 1;
}